

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cpp
# Opt level: O3

void __thiscall Color::Color(Color *this,string *str)

{
  ostream *poVar1;
  ostream *poVar2;
  LandstalkerException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  uint16_t b;
  uint16_t g;
  uint16_t r;
  stringstream ss;
  uint8_t local_1d6;
  uint8_t local_1d4;
  uint8_t local_1d2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  undefined1 local_1b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  uint auStack_188 [22];
  ios_base local_130 [264];
  
  this->_r = '\0';
  this->_g = '\0';
  this->_b = '\0';
  this->_invalid = true;
  if (str->_M_string_length == 7) {
    if (*(str->_M_dataplus)._M_p != '#') goto LAB_001c177f;
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    poVar2 = (ostream *)(local_1b0 + 0x10);
    *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[1];
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d0,1);
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[2];
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1d0,1);
    std::istream::_M_extract<unsigned_short>((ushort *)local_1b0);
    std::ios::clear((int)local_1b0 + (int)*(undefined8 *)(local_1b0._0_8_ + -0x18));
    *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[3];
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d0,1);
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[4];
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_1d0,1);
    std::istream::_M_extract<unsigned_short>((ushort *)local_1b0);
    std::ios::clear((int)local_1b0 + (int)*(undefined8 *)(local_1b0._0_8_ + -0x18));
    *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[5];
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d0,1);
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[6];
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d0,1);
    std::istream::_M_extract<unsigned_short>((ushort *)local_1b0);
  }
  else {
    if ((str->_M_string_length != 4) || (*(str->_M_dataplus)._M_p != '#')) {
LAB_001c177f:
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_1d0,"Could not parse Color from string \'",str);
      pbVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_1d0,"\'. Valid formats are \"#RGB\" and \"#RRGGBB\"");
      local_1b0._0_8_ = (pbVar3->_M_dataplus)._M_p;
      paVar4 = &pbVar3->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._0_8_ == paVar4) {
        local_1a0._M_allocated_capacity = paVar4->_M_allocated_capacity;
        local_1a0._8_8_ = *(undefined8 *)((long)&pbVar3->field_2 + 8);
        local_1b0._0_8_ = local_1b0 + 0x10;
      }
      else {
        local_1a0._M_allocated_capacity = paVar4->_M_allocated_capacity;
      }
      local_1b0._8_8_ = pbVar3->_M_string_length;
      (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
      pbVar3->_M_string_length = 0;
      (pbVar3->field_2)._M_local_buf[0] = '\0';
      LandstalkerException::LandstalkerException(this_00,(string *)local_1b0);
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)local_1b0);
    poVar2 = (ostream *)(local_1b0 + 0x10);
    *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[1];
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d0,1);
    std::istream::_M_extract<unsigned_short>((ushort *)local_1b0);
    std::ios::clear((int)local_1b0 + (int)*(undefined8 *)(local_1b0._0_8_ + -0x18));
    *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[2];
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d0,1);
    std::istream::_M_extract<unsigned_short>((ushort *)local_1b0);
    std::ios::clear((int)local_1b0 + (int)*(undefined8 *)(local_1b0._0_8_ + -0x18));
    *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) =
         *(uint *)((long)auStack_188 + *(long *)(local_1a0._M_allocated_capacity - 0x18)) &
         0xffffffb5 | 8;
    local_1d0._M_dataplus._M_p._0_1_ = (str->_M_dataplus)._M_p[3];
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_1d0,1);
    std::istream::_M_extract<unsigned_short>((ushort *)local_1b0);
    local_1d2 = local_1d2 << 4;
    local_1d4 = local_1d4 << 4;
    local_1d6 = local_1d6 << 4;
  }
  this->_r = local_1d2;
  this->_g = local_1d4;
  this->_b = local_1d6;
  this->_invalid = false;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

Color::Color(const std::string& str)
{
    uint16_t r, g, b;
    if(str.size() == 4 && str.starts_with('#'))
    {
        // Format 1 : "#RGB"
        std::stringstream ss;
        ss << std::hex << str[1];
        ss >> r;
        ss.clear();
        ss << std::hex << str[2];
        ss >> g;
        ss.clear();
        ss << std::hex << str[3];
        ss >> b;

        this->rgb((uint8_t)r << 4, (uint8_t)g << 4, (uint8_t)b << 4);
    }
    else if(str.size() == 7 && str.starts_with('#'))
    {
        // Format 2 : "#RRGGBB"
        std::stringstream ss;
        ss << std::hex << str[1] << str[2];
        ss >> r;
        ss.clear();
        ss << std::hex << str[3] << str[4];
        ss >> g;
        ss.clear();
        ss << std::hex << str[5] << str[6];
        ss >> b;

        this->rgb((uint8_t)r, (uint8_t)g, (uint8_t)b);
    }
    else
    {
        throw LandstalkerException("Could not parse Color from string '" + str + "'. "
                                   "Valid formats are \"#RGB\" and \"#RRGGBB\"");
    }
}